

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_HybridUUID.cpp
# Opt level: O0

string * calc_uuid_abi_cxx11_(string *__return_storage_ptr__,PlayerInfo *player)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  PlayerInfo *local_18;
  PlayerInfo *player_local;
  
  local_18 = player;
  player_local = (PlayerInfo *)__return_storage_ptr__;
  if (player->steamid == 0) {
    s_abi_cxx11_(&local_38,"N",1);
    std::operator+(__return_storage_ptr__,&local_38,&local_18->name);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    string_printf_abi_cxx11_(__return_storage_ptr__,"S%.16llX",player->steamid);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string calc_uuid(RenX::PlayerInfo &player)
{
	if (player.steamid != 0U)
		return string_printf("S%.16llX", player.steamid);
	return "N"s + player.name;
}